

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

DielectricMaterial *
pbrt::DielectricMaterial::Create
          (TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  DielectricMaterial *pDVar2;
  undefined8 in_RDX;
  string *in_RDI;
  bool remapRoughness;
  FloatTextureHandle displacement;
  FloatTextureHandle vRoughness;
  FloatTextureHandle uRoughness;
  SpectrumTextureHandle etaS;
  FloatTextureHandle etaF;
  string *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  double *in_stack_fffffffffffffd88;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffd90;
  Float defaultValue;
  string *in_stack_fffffffffffffd98;
  TextureParameterDictionary *in_stack_fffffffffffffda0;
  SpectrumTextureHandle *args_3;
  Allocator in_stack_fffffffffffffda8;
  allocator<char> *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  allocator<char> *args_5;
  string *in_stack_fffffffffffffdd8;
  string *name;
  TextureParameterDictionary *in_stack_fffffffffffffde0;
  TextureParameterDictionary *this;
  Allocator in_stack_fffffffffffffde8;
  Allocator alloc_00;
  allocator<char> local_1f1;
  string local_1f0 [4];
  SpectrumType in_stack_fffffffffffffe14;
  string *in_stack_fffffffffffffe18;
  TextureParameterDictionary *in_stack_fffffffffffffe20;
  Allocator in_stack_fffffffffffffe28;
  undefined8 local_1b9;
  undefined8 local_190;
  allocator<char> local_181;
  string local_180 [40];
  undefined8 local_158;
  undefined1 local_149 [41];
  undefined8 local_120;
  allocator<char> local_111;
  string local_110 [32];
  TaggedPointer local_f0 [8];
  undefined8 local_e8;
  undefined1 local_d9 [33];
  TaggedPointer local_b8 [8];
  undefined8 local_b0;
  undefined8 local_98;
  allocator<char> local_89;
  string local_88 [32];
  TaggedPointer local_68 [8];
  undefined8 local_60;
  allocator<char> local_41;
  string local_40 [32];
  TaggedPointer local_20 [16];
  string *local_10;
  undefined8 local_8;
  
  local_10 = in_RDI;
  local_8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  local_60 = local_8;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  alloc_00.memoryResource = (memory_resource *)local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  local_98 = local_8;
  TextureParameterDictionary::GetSpectrumTextureOrNull
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
             in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_20);
  if ((bVar1) && (bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_68), bVar1)) {
    Warning((FileLoc *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
            (char *)in_stack_fffffffffffffd78);
    FloatTextureHandle::TaggedPointer
              ((FloatTextureHandle *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (FloatTextureHandle *)in_stack_fffffffffffffd78);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_20);
  if ((!bVar1) && (bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_68), !bVar1)) {
    local_b0 = 0x3ff8000000000000;
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::FloatConstantTexture,double>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    FloatTextureHandle::TaggedPointer<pbrt::FloatConstantTexture>
              ((FloatTextureHandle *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (FloatConstantTexture *)in_stack_fffffffffffffd78);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (FloatTextureHandle *)in_stack_fffffffffffffd78);
  }
  defaultValue = (Float)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  this = (TextureParameterDictionary *)local_d9;
  name = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  local_e8 = local_8;
  TextureParameterDictionary::GetFloatTextureOrNull(this,name,alloc_00);
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  args_5 = &local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  local_120 = local_8;
  TextureParameterDictionary::GetFloatTextureOrNull(this,name,alloc_00);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    in_stack_fffffffffffffdc0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_149;
    in_stack_fffffffffffffdb8 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0
              );
    local_158 = local_8;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,defaultValue,
               in_stack_fffffffffffffda8);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (FloatTextureHandle *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string((string *)(local_149 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_149);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_f0);
  if (!bVar1) {
    in_stack_fffffffffffffdb0 = &local_181;
    in_stack_fffffffffffffda8.memoryResource = (memory_resource *)local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0
              );
    local_190 = local_8;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,defaultValue,
               in_stack_fffffffffffffda8);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (FloatTextureHandle *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator(&local_181);
  }
  args_3 = (SpectrumTextureHandle *)&local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  TextureParameterDictionary::GetFloatTextureOrNull(this,name,alloc_00);
  std::__cxx11::string::~string((string *)((long)&local_1b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  TextureParameterDictionary::GetOneBool
            ((TextureParameterDictionary *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),in_stack_fffffffffffffd78
             ,false);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  pDVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::DielectricMaterial,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,bool&>
                     ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffdc0,
                      (FloatTextureHandle *)in_stack_fffffffffffffdb8,
                      (FloatTextureHandle *)in_stack_fffffffffffffdb0,
                      (FloatTextureHandle *)in_stack_fffffffffffffda8.memoryResource,args_3,
                      (FloatTextureHandle *)local_10,(bool *)args_5);
  return pDVar2;
}

Assistant:

DielectricMaterial *DielectricMaterial::Create(
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    FloatTextureHandle etaF = parameters.GetFloatTextureOrNull("eta", alloc);
    SpectrumTextureHandle etaS =
        parameters.GetSpectrumTextureOrNull("eta", SpectrumType::General, alloc);
    if (etaF && etaS) {
        Warning(loc, "Both \"float\" and \"spectrum\" variants of \"eta\" parameter "
                     "were provided. Ignoring the \"float\" one.");
        etaF = nullptr;
    }
    if (!etaF && !etaS)
        etaF = alloc.new_object<FloatConstantTexture>(1.5);

    FloatTextureHandle uRoughness = parameters.GetFloatTextureOrNull("uroughness", alloc);
    FloatTextureHandle vRoughness = parameters.GetFloatTextureOrNull("vroughness", alloc);
    if (!uRoughness)
        uRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);
    if (!vRoughness)
        vRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);
    return alloc.new_object<DielectricMaterial>(uRoughness, vRoughness, etaF, etaS,
                                                displacement, remapRoughness);
}